

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect6-error.c
# Opt level: O2

int run_test_tcp_connect6_link_local(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_interface_address_t *puVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b_2;
  int64_t eval_b_3;
  int n;
  uv_interface_address_t *ifs;
  uv_connect_t req;
  sockaddr_in6 addr;
  uv_tcp_t server;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    pcVar4 = "IPv6 not supported";
  }
  else {
    iVar1 = uv_interface_addresses(&ifs,&n);
    server.data = (void *)(long)iVar1;
    req.data = (void *)0x0;
    if (server.data != (void *)0x0) {
      pcVar4 = "uv_interface_addresses(&ifs, &n)";
      uVar6 = 99;
LAB_00185e57:
      req.data = (void *)0x0;
      pcVar5 = "0";
      eval_b_3 = 0;
      eval_b_2 = (int64_t)server.data;
LAB_00185f4a:
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect6-error.c"
              ,uVar6,pcVar4,"==",pcVar5,eval_b_2,"==",eval_b_3);
      abort();
    }
    for (puVar3 = ifs; puVar3 < ifs + n; puVar3 = puVar3 + 1) {
      if (((puVar3->address).address4.sin_family == 10) &&
         (*(short *)((long)&puVar3->address + 8) == -0x7f02)) {
        uv_free_interface_addresses(ifs,n);
        iVar1 = uv_ip6_addr("fe80::0bad:babe",0x539,&addr);
        server.data = (void *)(long)iVar1;
        req.data = (void *)0x0;
        if (server.data != (void *)0x0) {
          pcVar4 = "uv_ip6_addr(\"fe80::0bad:babe\", 1337, &addr)";
          uVar6 = 0x6e;
          goto LAB_00185e57;
        }
        puVar2 = uv_default_loop();
        iVar1 = uv_tcp_init(puVar2,&server);
        req.data = (void *)(long)iVar1;
        if (req.data == (void *)0x0) {
          iVar1 = uv_tcp_connect(&req,&server,(sockaddr *)&addr,connect_cb);
          eval_b_2 = (int64_t)iVar1;
          eval_b_3 = 0;
          if ((void *)eval_b_2 == (void *)0x0) {
            uv_close((uv_handle_t *)&server,(uv_close_cb)0x0);
            puVar2 = uv_default_loop();
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            eval_b_2 = (int64_t)iVar1;
            eval_b_3 = 0;
            if ((void *)eval_b_2 == (void *)0x0) {
              puVar2 = uv_default_loop();
              close_loop(puVar2);
              eval_b_2 = 0;
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              eval_b_3 = (int64_t)iVar1;
              if (eval_b_3 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar5 = "uv_loop_close(uv_default_loop())";
              pcVar4 = "0";
              uVar6 = 0x7f;
            }
            else {
              pcVar5 = "0";
              pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
              uVar6 = 0x7d;
            }
          }
          else {
            pcVar5 = "0";
            pcVar4 = "uv_tcp_connect(&req, &server, (struct sockaddr*) &addr, connect_cb)";
            uVar6 = 0x7a;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "uv_tcp_init(uv_default_loop(), &server)";
          uVar6 = 0x6f;
          eval_b_3 = 0;
          eval_b_2 = (int64_t)req.data;
        }
        goto LAB_00185f4a;
      }
    }
    uv_free_interface_addresses(ifs,n);
    pcVar4 = "IPv6 link-local traffic not supported";
  }
  fprintf(_stderr,"%s\n",pcVar4);
  fflush(_stderr);
  return 7;
}

Assistant:

TEST_IMPL(tcp_connect6_link_local) {
  uv_interface_address_t* ifs;
  uv_interface_address_t* p;
  struct sockaddr_in6 addr;
  uv_connect_t req;
  uv_tcp_t server;
  int ok;
  int n;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

#if defined(__QEMU__)
  /* qemu's sockaddr_in6 translation is broken pre-qemu 8.0.0
   * when host endianness != guest endiannes.
   * Fixed in https://github.com/qemu/qemu/commit/44cf6731d6b.
   */
  RETURN_SKIP("Test does not currently work in QEMU");
#endif  /* defined(__QEMU__) */

  /* Check there's an interface that routes link-local (fe80::/10) traffic. */
  ASSERT_OK(uv_interface_addresses(&ifs, &n));
  for (p = ifs; p < &ifs[n]; p++)
    if (p->address.address6.sin6_family == AF_INET6)
      if (!memcmp(&p->address.address6.sin6_addr, "\xfe\x80", 2))
        break;
  ok = (p < &ifs[n]);
  uv_free_interface_addresses(ifs, n);

  if (!ok)
    RETURN_SKIP("IPv6 link-local traffic not supported");

  ASSERT_OK(uv_ip6_addr("fe80::0bad:babe", 1337, &addr));
  ASSERT_OK(uv_tcp_init(uv_default_loop(), &server));

  /* We're making two shaky assumptions here:
   * 1. There is a network interface that routes IPv6 link-local traffic, and
   * 2. There is no firewall rule that blackholes or otherwise hard-kills the
   *    connection attempt to the address above, i.e., we don't expect the
   *    connect() system call to fail synchronously.
   */
  ASSERT_OK(uv_tcp_connect(&req,
                           &server,
                           (struct sockaddr*) &addr,
                           connect_cb));

  uv_close((uv_handle_t*) &server, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}